

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O3

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  uint *puVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  ulong *puVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  uint *pInfo;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  Gia_Obj_t *pGVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  Gia_Obj_t *pGVar29;
  long lVar30;
  
  if (p->vTruths != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruths == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x4d,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar10 = ((p->nObjs >> 4) + 1) - (uint)((p->nObjs & 0xfU) == 0);
  p->nTtWords = iVar10;
  lVar30 = (long)iVar10 * ((long)pCex->iFrame + 1);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar10 = (int)lVar30;
  iVar26 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar26 = iVar10;
  }
  pVVar8->nCap = iVar26;
  if (iVar26 == 0) {
    pVVar8->pArray = (int *)0x0;
    pVVar8->nSize = iVar10;
  }
  else {
    piVar9 = (int *)malloc((long)iVar26 << 2);
    pVVar8->pArray = piVar9;
    pVVar8->nSize = iVar10;
    if (piVar9 != (int *)0x0) {
      memset(piVar9,0,lVar30 * 4);
    }
  }
  p->vTruths = pVVar8;
  Gia_ManCleanMark0(p);
  iVar10 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar26 = p->nRegs;
    iVar20 = 0;
    do {
      pVVar8 = p->vCis;
      uVar27 = (ulong)(uint)pVVar8->nSize;
      if (iVar26 < pVVar8->nSize) {
        lVar30 = 0;
        do {
          if ((int)uVar27 <= lVar30) goto LAB_005829ab;
          iVar26 = pVVar8->pArray[lVar30];
          if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0058294e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar24 = iVar10 + (int)lVar30;
          pGVar5 = p->pObjs + iVar26;
          uVar25 = (&pCex[1].iPo)[(int)uVar24 >> 5];
          *(ulong *)pGVar5 =
               *(ulong *)pGVar5 & 0xffffffffbfffffff |
               (ulong)((uint)((uVar25 >> (uVar24 & 0x1f) & 1) != 0) << 0x1e);
          if ((uVar25 >> (uVar24 & 0x1f) & 1) != 0) {
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0058296d;
            uVar25 = p->nTtWords * iVar20;
            if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0058298c;
            iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar26 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar26 * '\x02' & 0x1fU);
          }
          lVar30 = lVar30 + 1;
          pVVar8 = p->vCis;
          uVar27 = (ulong)pVVar8->nSize;
        } while (lVar30 < (long)(uVar27 - (long)p->nRegs));
        iVar10 = iVar10 + (int)lVar30;
      }
      if (0 < p->nObjs) {
        lVar30 = 0;
        lVar22 = 0;
        do {
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar29 = (Gia_Obj_t *)(&pGVar5->field_0x0 + lVar30);
          uVar27 = *(ulong *)pGVar29;
          if (((uVar27 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar27) &&
             (uVar25 = ((uint)(uVar27 >> 0x3d) ^
                       *(uint *)((long)pGVar29 + (ulong)((uint)(uVar27 >> 0x1e) & 0x7ffffffc) * -3)
                       >> 0x1e) &
                       ((uint)(uVar27 >> 0x1d) & 7 ^
                       *(uint *)((long)pGVar29 + (ulong)(uint)((int)(uVar27 & 0x1fffffff) << 2) * -3
                                ) >> 0x1e) & 1,
             *(ulong *)(&pGVar5->field_0x0 + lVar30) =
                  uVar27 & 0xffffffff3fffffff | (ulong)(uVar25 << 0x1e), uVar25 != 0)) {
            pGVar16 = p->pObjs;
            if ((pGVar29 < pGVar16) || (pGVar16 + p->nObjs <= pGVar29)) goto LAB_0058296d;
            uVar25 = p->nTtWords * iVar20;
            if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0058298c;
            iVar26 = (int)((ulong)((long)pGVar5 + (lVar30 - (long)pGVar16)) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar26 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar26 * '\x02' & 0x1fU);
          }
          lVar22 = lVar22 + 1;
          lVar30 = lVar30 + 0xc;
        } while (lVar22 < p->nObjs);
      }
      pVVar8 = p->vCos;
      if (0 < pVVar8->nSize) {
        lVar30 = 0;
        do {
          iVar26 = pVVar8->pArray[lVar30];
          if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0058294e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar5 = p->pObjs + iVar26;
          uVar27 = *(ulong *)pGVar5;
          uVar24 = (uint)(uVar27 >> 0x1d) & 1;
          uVar25 = *(uint *)(pGVar5 + -(ulong)((uint)uVar27 & 0x1fffffff)) >> 0x1e & 1;
          *(ulong *)pGVar5 = uVar27 & 0xffffffffbfffffff | (ulong)((uVar25 ^ uVar24) << 0x1e);
          if (uVar25 != uVar24) {
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0058296d;
            uVar25 = p->nTtWords * iVar20;
            if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0058298c;
            iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar26 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar26 * '\x02' & 0x1fU);
          }
          lVar30 = lVar30 + 1;
          pVVar8 = p->vCos;
        } while (lVar30 < pVVar8->nSize);
      }
      iVar21 = pCex->iFrame;
      if (iVar20 == iVar21) break;
      iVar26 = p->nRegs;
      if (0 < iVar26) {
        iVar21 = 0;
        do {
          iVar3 = p->vCos->nSize;
          uVar25 = (iVar3 - iVar26) + iVar21;
          if (((int)uVar25 < 0) || (iVar3 <= (int)uVar25)) goto LAB_005829ab;
          iVar3 = p->vCos->pArray[uVar25];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0058294e;
          pGVar5 = p->pObjs;
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          iVar4 = p->vCis->nSize;
          uVar25 = (iVar4 - iVar26) + iVar21;
          if (((int)uVar25 < 0) || (iVar4 <= (int)uVar25)) goto LAB_005829ab;
          uVar25 = p->vCis->pArray[uVar25];
          lVar30 = (long)(int)uVar25;
          if ((lVar30 < 0) || ((uint)p->nObjs <= uVar25)) goto LAB_0058294e;
          uVar25 = *(uint *)(pGVar5 + iVar3) >> 0x1e & 1;
          *(ulong *)(pGVar5 + lVar30) =
               *(ulong *)(pGVar5 + lVar30) & 0xffffffffbfffffff | (ulong)(uVar25 << 0x1e);
          if (uVar25 != 0) {
            pGVar5 = pGVar5 + lVar30;
            pGVar29 = p->pObjs;
            if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0058296d;
            uVar25 = p->nTtWords * (iVar20 + 1);
            if (((int)uVar25 < 0) || (p->vTruths->nSize <= (int)uVar25)) goto LAB_0058298c;
            iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
            puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar25 + (long)(iVar26 >> 4));
            *puVar1 = *puVar1 | 1 << ((char)iVar26 * '\x02' & 0x1fU);
          }
          iVar21 = iVar21 + 1;
          iVar26 = p->nRegs;
        } while (iVar21 < iVar26);
        iVar21 = pCex->iFrame;
      }
      bVar6 = iVar20 < iVar21;
      iVar20 = iVar20 + 1;
    } while (bVar6);
  }
  if (iVar10 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,99,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  uVar25 = pCex->iPo;
  iVar10 = p->vCos->nSize;
  if (iVar10 - p->nRegs <= (int)uVar25) {
LAB_00582a46:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (((int)uVar25 < 0) || (iVar10 <= (int)uVar25)) {
LAB_005829ab:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar10 = p->vCos->pArray[uVar25];
  if ((-1 < (long)iVar10) && (iVar10 < p->nObjs)) {
    uVar25 = *(uint *)(p->pObjs + iVar10);
    if ((uVar25 >> 0x1e & 1) == 0) {
      puts("Counter-example is invalid.");
    }
    Gia_ManCleanMark0(p);
    uVar24 = pCex->iPo;
    iVar10 = p->vCos->nSize;
    if (iVar10 - p->nRegs <= (int)uVar24) goto LAB_00582a46;
    if (((int)uVar24 < 0) || (iVar10 <= (int)uVar24)) goto LAB_005829ab;
    iVar10 = p->vCos->pArray[uVar24];
    if ((-1 < (long)iVar10) && (iVar10 < p->nObjs)) {
      pGVar5 = p->pObjs + iVar10;
      *(ulong *)pGVar5 = *(ulong *)pGVar5 | 0x40000000;
      pGVar29 = p->pObjs;
      if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) {
LAB_0058296d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar24 = pCex->iFrame * p->nTtWords;
      if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) {
LAB_0058298c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar10 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
      puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar10 >> 4));
      *puVar1 = *puVar1 | 2 << ((char)iVar10 * '\x02' & 0x1fU);
      iVar10 = pCex->iFrame;
      if (iVar10 < 0) {
LAB_0058292b:
        Gia_ManCleanMark0(p);
        return uVar25 >> 0x1e & 1;
      }
      do {
        pVVar8 = p->vCos;
        if (0 < pVVar8->nSize) {
          lVar30 = 0;
          do {
            iVar26 = pVVar8->pArray[lVar30];
            if (((long)iVar26 < 0) || (p->nObjs <= iVar26)) goto LAB_0058294e;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar5 = p->pObjs + iVar26;
            uVar27 = *(ulong *)pGVar5 >> 0x1e;
            uVar11 = (ulong)((uint)*(ulong *)pGVar5 & 0x1fffffff);
            *(ulong *)(pGVar5 + -uVar11) =
                 *(ulong *)(pGVar5 + -uVar11) & 0xffffffffbfffffff |
                 (ulong)(((uint)uVar27 & 1) << 0x1e);
            if ((uVar27 & 1) != 0) {
              uVar27 = *(ulong *)pGVar5;
              *(ulong *)pGVar5 = uVar27 & 0xffffffffbfffffff;
              pGVar5 = pGVar5 + -(ulong)((uint)uVar27 & 0x1fffffff);
              pGVar29 = p->pObjs;
              if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0058296d;
              uVar24 = p->nTtWords * iVar10;
              if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_0058298c;
              iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar26 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar26 * '\x02' & 0x1fU);
            }
            lVar30 = lVar30 + 1;
            pVVar8 = p->vCos;
          } while (lVar30 < pVVar8->nSize);
        }
        uVar27 = (ulong)p->nObjs;
        if (1 < (long)uVar27) {
          lVar30 = uVar27 * 0xc;
          do {
            lVar22 = lVar30 + -0xc;
            if ((long)p->nObjs < (long)uVar27) goto LAB_0058294e;
            pGVar5 = p->pObjs;
            if (pGVar5 == (Gia_Obj_t *)0x0) break;
            uVar18 = uVar27 - 1;
            pGVar29 = (Gia_Obj_t *)(&pGVar5[-1].field_0x0 + lVar30);
            uVar11 = *(ulong *)pGVar29;
            if (((uint)uVar11 & 0xc0000000) == 0x40000000 && (uVar11 & 0x1fffffff) != 0x1fffffff) {
              *(ulong *)pGVar29 = uVar11 & 0xffffffff3fffffff;
              pGVar16 = p->pObjs;
              if ((pGVar29 < pGVar16) || (pGVar14 = pGVar16 + p->nObjs, pGVar14 <= pGVar29))
              goto LAB_0058296d;
              uVar24 = p->nTtWords * iVar10;
              if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_0058298c;
              iVar20 = (int)((ulong)((long)pGVar5 + (lVar22 - (long)pGVar16)) >> 2);
              piVar9 = p->vTruths->pArray;
              iVar26 = (int)(uVar11 & 0x1fffffff);
              pGVar23 = (Gia_Obj_t *)((long)pGVar5 + lVar22 + (ulong)(uint)(iVar26 * 4) * -3);
              if ((pGVar23 < pGVar16) || (pGVar14 <= pGVar23)) goto LAB_0058296d;
              iVar26 = (int)((long)pGVar5 +
                             lVar22 + ((ulong)(uint)(iVar26 << 2) * -3 - (long)pGVar16) >> 2);
              uVar19 = (uint)(uVar11 >> 0x20);
              uVar17 = uVar19 & 0x1fffffff;
              pGVar12 = (Gia_Obj_t *)((long)pGVar5 + lVar22 + (ulong)(uVar17 * 4) * -3);
              if ((pGVar12 < pGVar16) || (pGVar14 <= pGVar12)) goto LAB_0058296d;
              uVar7 = (uint)(uVar11 >> 0x1d) & 1;
              uVar15 = (uint)(((uint)piVar9[(ulong)uVar24 + (long)(iVar26 * -0x55555555 >> 4)] >>
                               (iVar26 * 0x55555556 & 0x1fU) & 1) != 0);
              uVar28 = uVar15 ^ uVar7;
              iVar26 = (int)((long)pGVar5 + lVar22 + ((ulong)(uVar17 << 2) * -3 - (long)pGVar16) >>
                            2);
              uVar19 = uVar19 >> 0x1d & 1;
              uVar17 = (uint)(((uint)piVar9[(ulong)uVar24 + (long)(iVar26 * -0x55555555 >> 4)] >>
                               (iVar26 * 0x55555556 & 0x1fU) & 1) != 0);
              uVar24 = (uint)(((uint)piVar9[(ulong)uVar24 + (long)(iVar20 * -0x55555555 >> 4)] >>
                               (iVar20 * 0x55555556 & 0x1fU) & 1) != 0);
              if (uVar28 == (uVar17 ^ uVar19)) {
                if (uVar24 != uVar28) {
                  __assert_fail("Value == (Value0 & Value1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar24 == 0 && fJustMax == 0) {
                  pGVar23->field_0x3 = pGVar23->field_0x3 | 0x40;
                  uVar24 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff;
                  pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar24 * 4) * -3);
                  pGVar16 = p->pObjs;
                  if ((pGVar16 <= pGVar29) && (pGVar29 < pGVar16 + p->nObjs)) {
LAB_00582708:
                    uVar17 = p->nTtWords * iVar10;
                    if ((-1 < (int)uVar17) && (pVVar8 = p->vTruths, (int)uVar17 < pVVar8->nSize)) {
                      lVar30 = ((ulong)uVar24 * -0xc + uVar18 * 0xc) - (long)pGVar16;
                      goto LAB_00582738;
                    }
                    goto LAB_0058298c;
                  }
                  goto LAB_0058296d;
                }
                pGVar12->field_0x3 = pGVar12->field_0x3 | 0x40;
                puVar13 = (ulong *)((long)pGVar29 +
                                   (ulong)((*(uint *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff)
                                          << 2) * -3);
                *puVar13 = *puVar13 | 0x40000000;
                uVar24 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff;
                pGVar14 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar24 * 4) * -3);
                pGVar16 = p->pObjs;
                if ((pGVar14 < pGVar16) || (pGVar16 + p->nObjs <= pGVar14)) goto LAB_0058296d;
                uVar17 = p->nTtWords * iVar10;
                if (((int)uVar17 < 0) || (pVVar8 = p->vTruths, pVVar8->nSize <= (int)uVar17))
                goto LAB_0058298c;
                iVar26 = (int)((long)pGVar5 + lVar22 + ((ulong)(uVar24 << 2) * -3 - (long)pGVar16)
                              >> 2) * -0x55555555;
                piVar9 = pVVar8->pArray;
                piVar9[(ulong)uVar17 + (long)(iVar26 >> 4)] =
                     piVar9[(ulong)uVar17 + (long)(iVar26 >> 4)] |
                     2 << ((char)iVar26 * '\x02' & 0x1fU);
                uVar24 = *(uint *)(&pGVar5[-1].field_0x4 + lVar30) & 0x1fffffff;
                pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar24 * 4) * -3);
                if ((pGVar29 < pGVar16) || (pGVar16 + p->nObjs <= pGVar29)) goto LAB_0058296d;
                uVar17 = p->nTtWords * iVar10;
                if (((int)uVar17 < 0) || (pVVar8->nSize <= (int)uVar17)) goto LAB_0058298c;
                lVar30 = ((ulong)uVar24 * -0xc + uVar18 * 0xc) - (long)pGVar16;
              }
              else {
                if (uVar15 == uVar7) {
                  if (uVar24 != 0) {
                    __assert_fail("Value == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                  ,0x90,
                                  "int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
                  }
                  pGVar23->field_0x3 = pGVar23->field_0x3 | 0x40;
                  uVar24 = (uint)*(undefined8 *)(&pGVar5[-1].field_0x0 + lVar30) & 0x1fffffff;
                  pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar24 * 4) * -3);
                  pGVar16 = p->pObjs;
                  if ((pGVar16 <= pGVar29) && (pGVar29 < pGVar16 + p->nObjs)) goto LAB_00582708;
                  goto LAB_0058296d;
                }
                if (uVar17 != uVar19) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                if (uVar24 != 0) {
                  __assert_fail("Value == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                                ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)")
                  ;
                }
                pGVar12->field_0x3 = pGVar12->field_0x3 | 0x40;
                uVar24 = *(uint *)(&pGVar5[-1].field_0x4 + lVar30) & 0x1fffffff;
                pGVar29 = (Gia_Obj_t *)((long)pGVar29 + (ulong)(uVar24 * 4) * -3);
                pGVar16 = p->pObjs;
                if ((pGVar29 < pGVar16) || (pGVar16 + p->nObjs <= pGVar29)) goto LAB_0058296d;
                uVar17 = p->nTtWords * iVar10;
                if (((int)uVar17 < 0) || (pVVar8 = p->vTruths, pVVar8->nSize <= (int)uVar17))
                goto LAB_0058298c;
                lVar30 = lVar22 + ((ulong)(uVar24 << 2) * -3 - (long)pGVar16);
LAB_00582738:
                piVar9 = pVVar8->pArray;
              }
              iVar26 = (int)((ulong)(&pGVar5->field_0x0 + lVar30) >> 2) * -0x55555555;
              piVar9[(ulong)uVar17 + (long)(iVar26 >> 4)] =
                   piVar9[(ulong)uVar17 + (long)(iVar26 >> 4)] |
                   2 << ((char)iVar26 * '\x02' & 0x1fU);
            }
            bVar6 = 2 < uVar27;
            uVar27 = uVar18;
            lVar30 = lVar22;
          } while (bVar6);
        }
        if (iVar10 == 0) goto LAB_0058292b;
        iVar26 = p->nRegs;
        pVVar8 = p->vCis;
        iVar20 = pVVar8->nSize;
        if (iVar26 < iVar20) {
          lVar30 = 0;
          do {
            if (iVar20 <= lVar30) goto LAB_005829ab;
            iVar20 = pVVar8->pArray[lVar30];
            if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) goto LAB_0058294e;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            puVar2 = &p->pObjs[iVar20].field_0x3;
            *puVar2 = *puVar2 & 0xbf;
            lVar30 = lVar30 + 1;
            iVar26 = p->nRegs;
            pVVar8 = p->vCis;
            iVar20 = pVVar8->nSize;
          } while (lVar30 < iVar20 - iVar26);
        }
        iVar10 = iVar10 + -1;
        if (0 < iVar26) {
          iVar20 = 0;
          do {
            iVar21 = p->vCos->nSize;
            uVar24 = (iVar21 - iVar26) + iVar20;
            if (((int)uVar24 < 0) || (iVar21 <= (int)uVar24)) goto LAB_005829ab;
            iVar21 = p->vCos->pArray[uVar24];
            if (((long)iVar21 < 0) || (p->nObjs <= iVar21)) goto LAB_0058294e;
            pGVar29 = p->pObjs;
            pGVar5 = pGVar29 + iVar21;
            if (pGVar29 == (Gia_Obj_t *)0x0) break;
            iVar21 = p->vCis->nSize;
            uVar24 = (iVar21 - iVar26) + iVar20;
            if (((int)uVar24 < 0) || (iVar21 <= (int)uVar24)) goto LAB_005829ab;
            uVar24 = p->vCis->pArray[uVar24];
            lVar30 = (long)(int)uVar24;
            if ((lVar30 < 0) || ((uint)p->nObjs <= uVar24)) goto LAB_0058294e;
            uVar24 = *(uint *)(pGVar29 + lVar30) >> 0x1e & 1;
            *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)(uVar24 << 0x1e);
            if (uVar24 != 0) {
              pGVar29[lVar30].field_0x3 = pGVar29[lVar30].field_0x3 & 0xbf;
              pGVar29 = p->pObjs;
              if ((pGVar5 < pGVar29) || (pGVar29 + p->nObjs <= pGVar5)) goto LAB_0058296d;
              uVar24 = p->nTtWords * iVar10;
              if (((int)uVar24 < 0) || (p->vTruths->nSize <= (int)uVar24)) goto LAB_0058298c;
              iVar26 = (int)((ulong)((long)pGVar5 - (long)pGVar29) >> 2) * -0x55555555;
              puVar1 = (uint *)(p->vTruths->pArray + (ulong)uVar24 + (long)(iVar26 >> 4));
              *puVar1 = *puVar1 | 2 << ((char)iVar26 * '\x02' & 0x1fU);
            }
            iVar20 = iVar20 + 1;
            iVar26 = p->nRegs;
          } while (iVar20 < iVar26);
        }
      } while( true );
    }
  }
LAB_0058294e:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}